

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O1

void godvoice(aligntyp g_align,char *words)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  
  bVar4 = words == (char *)0x0;
  if (bVar4) {
    words = "";
  }
  pcVar3 = "\"";
  if (bVar4) {
    pcVar3 = "";
  }
  pcVar2 = align_gname(g_align);
  uVar1 = mt_random();
  pline("The voice of %s %s: %s%s%s",pcVar2,
        godvoices_rel + *(int *)(godvoices_rel + (ulong)(uVar1 & 3) * 4),pcVar3,words,pcVar3);
  return;
}

Assistant:

static void godvoice(aligntyp g_align, const char *words)
{
    const char *quot = "";
    if (words)
	quot = "\"";
    else
	words = "";

    pline("The voice of %s %s: %s%s%s", align_gname(g_align),
	  godvoices[rn2(SIZE(godvoices))], quot, words, quot);
}